

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerMSL::preprocess_op_codes(CompilerMSL *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  size_t sVar3;
  TypedID<(spirv_cross::Types)0> *pTVar4;
  Variant *pVVar5;
  bool bVar6;
  ExecutionModel EVar7;
  SPIRFunction *func;
  SPIRBlock *pSVar8;
  long lVar9;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar10;
  OpCodePreprocessor preproc;
  string local_e0;
  OpcodeHandler local_c0;
  CompilerMSL *local_b8;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_b0;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_78;
  bool local_40;
  undefined8 local_3f;
  
  local_c0._vptr_OpcodeHandler = (_func_int **)&PTR__OpCodePreprocessor_003f9d58;
  local_b0._M_buckets = &local_b0._M_single_bucket;
  local_b0._M_bucket_count = 1;
  local_b0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b0._M_element_count = 0;
  local_b0._M_rehash_policy._M_max_load_factor = 1.0;
  local_b0._M_rehash_policy._M_next_resize = 0;
  local_b0._M_single_bucket = (__node_base_ptr)0x0;
  local_78._M_buckets = &local_78._M_single_bucket;
  local_78._M_bucket_count = 1;
  local_78._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_78._M_element_count = 0;
  local_78._M_rehash_policy._M_max_load_factor = 1.0;
  local_78._M_rehash_policy._M_next_resize = 0;
  local_78._M_single_bucket._0_1_ = 0;
  local_78._M_single_bucket._1_7_ = 0;
  local_40 = false;
  local_3f = 0;
  local_b8 = this;
  func = Variant::get<spirv_cross::SPIRFunction>
                   ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                    super_VectorView<spirv_cross::Variant>.ptr +
                    (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
  Compiler::traverse_all_reachable_opcodes((Compiler *)this,func,&local_c0);
  this->suppress_missing_prototypes = local_40;
  if ((char)local_3f == '\x01') {
    paVar1 = &local_e0.field_2;
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"#include <metal_atomic>","");
    CompilerGLSL::add_header_line(&this->super_CompilerGLSL,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"#pragma clang diagnostic ignored \"-Wunused-variable\"","");
    pVar10 = ::std::
             _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
             ::_M_insert_unique<std::__cxx11::string_const&>
                       ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                         *)&this->pragma_lines,&local_e0);
    if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      Compiler::force_recompile((Compiler *)this);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
  }
  uVar2 = (this->msl_options).msl_version;
  if (((local_3f._2_1_ & uVar2 < 0x4e84) != 0) || ((uVar2 < 0x4ee8 & local_3f._1_1_) == 1)) {
    this->is_rasterization_disabled = true;
  }
  EVar7 = Compiler::get_execution_model((Compiler *)this);
  if ((EVar7 == ExecutionModelTessellationControl) ||
     ((EVar7 = Compiler::get_execution_model((Compiler *)this), EVar7 == ExecutionModelVertex &&
      ((this->msl_options).vertex_for_tessellation == true)))) {
    this->is_rasterization_disabled = true;
    this->capture_output_to_buffer = true;
  }
  if (local_3f._4_1_ == '\x01') {
    this->needs_subgroup_invocation_id = true;
  }
  if (local_3f._5_1_ == '\x01') {
    this->needs_subgroup_size = true;
  }
  if (((local_3f._6_1_ != '\0') || ((this->msl_options).force_sample_rate_shading != false)) ||
     ((bVar6 = is_sample_rate(this), bVar6 &&
      ((((this->super_CompilerGLSL).super_Compiler.active_input_builtins.lower & 0x8000) != 0 ||
       (((this->super_CompilerGLSL).super_Compiler.need_subpass_input_ms == true &&
        ((this->msl_options).use_framebuffer_fetch_subpasses == false)))))))) {
    this->needs_sample_id = true;
  }
  if (local_3f._7_1_ == '\x01') {
    this->needs_helper_invocation = true;
  }
  ParsedIR::create_loop_hard_lock(&(this->super_CompilerGLSL).super_Compiler.ir);
  sVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[6].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar3 != 0) {
    pTVar4 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[6].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar9 = 0;
    do {
      uVar2 = *(uint *)((long)&pTVar4->id + lVar9);
      pVVar5 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      if ((pVVar5[uVar2].type == TypeBlock) &&
         (pSVar8 = Variant::get<spirv_cross::SPIRBlock>(pVVar5 + uVar2),
         *(int *)&(pSVar8->super_IVariant).field_0xc == 6)) {
        local_3f._0_4_ = CONCAT13(1,(undefined3)local_3f);
      }
      lVar9 = lVar9 + 4;
    } while (sVar3 << 2 != lVar9);
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&local_e0);
  if ((((this->msl_options).check_discarded_frag_stores == true) && (local_3f._3_1_ == '\x01')) &&
     ((local_3f._2_1_ != '\0' || (local_3f._1_1_ == '\x01')))) {
    this->frag_shader_needs_discard_checks = true;
    this->needs_helper_invocation = true;
    (this->msl_options).manual_helper_invocation_updates = true;
  }
  bVar6 = is_intersection_query(this);
  if (bVar6) {
    paVar1 = &local_e0.field_2;
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"#if __METAL_VERSION__ >= 230","");
    CompilerGLSL::add_header_line(&this->super_CompilerGLSL,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"#include <metal_raytracing>","");
    CompilerGLSL::add_header_line(&this->super_CompilerGLSL,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"using namespace metal::raytracing;","");
    CompilerGLSL::add_header_line(&this->super_CompilerGLSL,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"#endif","");
    CompilerGLSL::add_header_line(&this->super_CompilerGLSL,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
  }
  local_c0._vptr_OpcodeHandler = (_func_int **)&PTR__OpCodePreprocessor_003f9d58;
  ::std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_78);
  ::std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_b0);
  return;
}

Assistant:

void CompilerMSL::preprocess_op_codes()
{
	OpCodePreprocessor preproc(*this);
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), preproc);

	suppress_missing_prototypes = preproc.suppress_missing_prototypes;

	if (preproc.uses_atomics)
	{
		add_header_line("#include <metal_atomic>");
		add_pragma_line("#pragma clang diagnostic ignored \"-Wunused-variable\"");
	}

	// Before MSL 2.1 (2.2 for textures), Metal vertex functions that write to
	// resources must disable rasterization and return void.
	if ((preproc.uses_buffer_write && !msl_options.supports_msl_version(2, 1)) ||
	    (preproc.uses_image_write && !msl_options.supports_msl_version(2, 2)))
		is_rasterization_disabled = true;

	// Tessellation control shaders are run as compute functions in Metal, and so
	// must capture their output to a buffer.
	if (is_tesc_shader() || (get_execution_model() == ExecutionModelVertex && msl_options.vertex_for_tessellation))
	{
		is_rasterization_disabled = true;
		capture_output_to_buffer = true;
	}

	if (preproc.needs_subgroup_invocation_id)
		needs_subgroup_invocation_id = true;
	if (preproc.needs_subgroup_size)
		needs_subgroup_size = true;
	// build_implicit_builtins() hasn't run yet, and in fact, this needs to execute
	// before then so that gl_SampleID will get added; so we also need to check if
	// that function would add gl_FragCoord.
	if (preproc.needs_sample_id || msl_options.force_sample_rate_shading ||
	    (is_sample_rate() && (active_input_builtins.get(BuiltInFragCoord) ||
	                          (need_subpass_input_ms && !msl_options.use_framebuffer_fetch_subpasses))))
		needs_sample_id = true;
	if (preproc.needs_helper_invocation)
		needs_helper_invocation = true;

	// OpKill is removed by the parser, so we need to identify those by inspecting
	// blocks.
	ir.for_each_typed_id<SPIRBlock>([&preproc](uint32_t, SPIRBlock &block) {
		if (block.terminator == SPIRBlock::Kill)
			preproc.uses_discard = true;
	});

	// Fragment shaders that both write to storage resources and discard fragments
	// need checks on the writes, to work around Metal allowing these writes despite
	// the fragment being dead.
	if (msl_options.check_discarded_frag_stores && preproc.uses_discard &&
	    (preproc.uses_buffer_write || preproc.uses_image_write))
	{
		frag_shader_needs_discard_checks = true;
		needs_helper_invocation = true;
		// Fragment discard store checks imply manual HelperInvocation updates.
		msl_options.manual_helper_invocation_updates = true;
	}

	if (is_intersection_query())
	{
		add_header_line("#if __METAL_VERSION__ >= 230");
		add_header_line("#include <metal_raytracing>");
		add_header_line("using namespace metal::raytracing;");
		add_header_line("#endif");
	}
}